

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O3

string * __thiscall
duckdb::PragmaShowTablesExpanded_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  size_type sVar1;
  pointer __dest;
  size_type __dnew;
  size_type local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_20 = 0x2ed;
  __dest = (pointer)::std::__cxx11::string::_M_create
                              ((ulong *)__return_storage_ptr__,(ulong)&local_20);
  sVar1 = local_20;
  (__return_storage_ptr__->_M_dataplus)._M_p = __dest;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
  switchD_015df945::default
            (__dest,
             "\n\tSELECT\n\t\tt.database_name AS database,\n\t\tt.schema_name AS schema,\n\t\tt.table_name AS name,\n\t\tLIST(c.column_name order by c.column_index) AS column_names,\n\t\tLIST(c.data_type order by c.column_index) AS column_types,\n\t\tFIRST(t.temporary) AS temporary,\n\tFROM duckdb_tables t\n\tJOIN duckdb_columns c\n\tUSING (table_oid)\n\tGROUP BY database, schema, name\n\n\tUNION ALL\n\n\tSELECT\n\t\tv.database_name AS database,\n\t\tv.schema_name AS schema,\n\t\tv.view_name AS name,\n\t\tLIST(c.column_name order by c.column_index) AS column_names,\n\t\tLIST(c.data_type order by c.column_index) AS column_types,\n\t\tFIRST(v.temporary) AS temporary,\n\tFROM duckdb_views v\n\tJOIN duckdb_columns c\n\tON (v.view_oid=c.table_oid)\n\tGROUP BY database, schema, name\n\n\tORDER BY database, schema, name\n\t"
             ,0x2ed);
  __return_storage_ptr__->_M_string_length = sVar1;
  __dest[sVar1] = '\0';
  return __return_storage_ptr__;
}

Assistant:

string PragmaShowTablesExpanded(ClientContext &context, const FunctionParameters &parameters) {
	return PragmaShowTablesExpanded();
}